

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_ratio(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio)

{
  REF_NODE ref_node_00;
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  REF_DBL m [6];
  double local_68 [6];
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
      ((node1 < 0 || (ref_node->global[(uint)node0] < 0)))) || (ref_node->global[(uint)node1] < 0))
  {
    pcVar6 = "node invalid";
    uVar2 = 3;
    uVar4 = 0x57b;
    uVar5 = 3;
LAB_00146652:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_ratio",uVar5,pcVar6);
    return uVar2;
  }
  ref_node_00 = (REF_NODE)ref_node->real;
  uVar7 = (ulong)(uint)(node1 * 0xf);
  uVar5 = (ulong)(uint)(node0 * 0xf);
  dVar14 = *(double *)(&ref_node_00->n + uVar7 * 2) - *(double *)(&ref_node_00->n + uVar5 * 2);
  dVar13 = *(double *)(&ref_node_00->blank + uVar7 * 2) -
           *(double *)(&ref_node_00->blank + uVar5 * 2);
  dVar12 = (double)(&ref_node_00->global)[uVar7] - (double)(&ref_node_00->global)[uVar5];
  auVar9._0_8_ = SQRT(dVar12 * dVar12 + dVar14 * dVar14 + dVar13 * dVar13) * 1e+20;
  auVar9._8_8_ = dVar14;
  auVar10._8_8_ = -dVar14;
  auVar10._0_8_ = -auVar9._0_8_;
  auVar10 = maxpd(auVar9,auVar10);
  dVar8 = auVar10._0_8_;
  if (auVar10._8_8_ < dVar8) {
    dVar11 = dVar13;
    if (dVar13 <= -dVar13) {
      dVar11 = -dVar13;
    }
    if (dVar11 < dVar8) {
      dVar11 = dVar12;
      if (dVar12 <= -dVar12) {
        dVar11 = -dVar12;
      }
      if (dVar11 < dVar8) {
        if (ref_node->ratio_method != 2) {
          lVar3 = 0;
          do {
            local_68[lVar3] =
                 *(double *)(&ref_node_00->n + (long)(int)(node0 * 0xf + 3U + (int)lVar3) * 2);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 6);
          dVar8 = (local_68[5] * dVar12 + local_68[2] * dVar14 + local_68[4] * dVar13) * dVar12 +
                  (local_68[2] * dVar12 + local_68[0] * dVar14 + dVar13 * local_68[1]) * dVar14 +
                  (local_68[4] * dVar12 + local_68[1] * dVar14 + local_68[3] * dVar13) * dVar13;
          if (dVar8 < 0.0) {
            uStack_30 = 0;
            uStack_20 = 0;
            local_38 = dVar13;
            local_28 = dVar14;
            dVar8 = sqrt(dVar8);
            dVar13 = local_38;
            dVar14 = local_28;
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          pRVar1 = ref_node->real;
          lVar3 = 0;
          do {
            local_68[lVar3] = pRVar1[(int)(node1 * 0xf + 3U + (int)lVar3)];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 6);
          dVar13 = (local_68[5] * dVar12 + local_68[2] * dVar14 + dVar13 * local_68[4]) * dVar12 +
                   (local_68[2] * dVar12 + local_68[0] * dVar14 + dVar13 * local_68[1]) * dVar14 +
                   (local_68[4] * dVar12 + local_68[1] * dVar14 + local_68[3] * dVar13) * dVar13;
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          dVar14 = dVar8;
          if (dVar13 <= dVar8) {
            dVar14 = dVar13;
          }
          if ((1e-12 <= dVar8) && (1e-12 <= dVar13)) {
            local_38 = dVar8;
            if (dVar8 <= dVar13) {
              local_38 = dVar13;
            }
            local_38 = dVar14 / local_38;
            dVar11 = local_38 + -1.0;
            dVar12 = dVar11;
            if (dVar11 <= -dVar11) {
              dVar12 = -dVar11;
            }
            if (dVar12 < 1e-12) {
              *ratio = (dVar8 + dVar13) * 0.5;
              return 0;
            }
            dVar13 = log(local_38);
            *ratio = (dVar14 * dVar11) / (dVar13 * local_38);
            return 0;
          }
          *ratio = dVar14;
          return 0;
        }
        uVar2 = ref_node_ratio_log_quadrature(ref_node_00,node0,node1,ratio);
        if (uVar2 == 0) {
          return 0;
        }
        pcVar6 = "ratio";
        uVar4 = 0x58f;
        uVar5 = (ulong)uVar2;
        goto LAB_00146652;
      }
    }
  }
  *ratio = 0.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_ratio(REF_NODE ref_node, REF_INT node0,
                                  REF_INT node1, REF_DBL *ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, ratio1;
  REF_DBL r, r_min, r_max;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_ratio_log_quadrature(ref_node, node0, node1, ratio), "ratio");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  ratio0 = ref_matrix_sqrt_vt_m_v(m, direction);
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  ratio1 = ref_matrix_sqrt_vt_m_v(m, direction);

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    *ratio = MIN(ratio0, ratio1);
    return REF_SUCCESS;
  }

  r_min = MIN(ratio0, ratio1);
  r_max = MAX(ratio0, ratio1);

  r = r_min / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (ratio0 + ratio1);
    return REF_SUCCESS;
  }

  *ratio = r_min * (r - 1.0) / (r * log(r));

  return REF_SUCCESS;
}